

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

cmd_ln_t * cmd_ln_init(cmd_ln_t *inout_cmdln,arg_t *defn,int32 strict,...)

{
  char in_AL;
  uint uVar1;
  char **argv;
  char *pcVar2;
  undefined8 *puVar3;
  cmd_ln_t *pcVar4;
  undefined8 in_RCX;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  size_t n_elem;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  plVar7 = (long *)&stack0x00000008;
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  uVar1 = 0x18;
  n_elem = 0;
  args[0].overflow_arg_area = plVar7;
  while( true ) {
    if (uVar1 < 0x29) {
      uVar5 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      args[0].gp_offset = uVar1;
      plVar6 = (long *)((long)local_e8 + uVar5);
      plVar8 = plVar7;
    }
    else {
      plVar8 = plVar7 + 1;
      plVar6 = plVar7;
      args[0].overflow_arg_area = plVar8;
    }
    if (*plVar6 == 0) {
      argv = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                     ,0x2d9);
      uVar1 = 0x18;
      args[0].overflow_arg_area = &stack0x00000008;
      lVar9 = 0;
      while( true ) {
        uVar5 = (ulong)uVar1;
        if (uVar5 < 0x29) {
          uVar1 = uVar1 + 8;
          puVar3 = (undefined8 *)((long)local_e8 + uVar5);
        }
        else {
          puVar3 = (undefined8 *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        if ((char *)*puVar3 == (char *)0x0) break;
        pcVar2 = __ckd_salloc__((char *)*puVar3,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2dd);
        argv[lVar9] = pcVar2;
        uVar5 = (ulong)uVar1;
        if (uVar5 < 0x29) {
          uVar1 = uVar1 + 8;
          puVar3 = (undefined8 *)((long)local_e8 + uVar5);
        }
        else {
          puVar3 = (undefined8 *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        pcVar2 = __ckd_salloc__((char *)*puVar3,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2e0);
        argv[lVar9 + 1] = pcVar2;
        lVar9 = lVar9 + 2;
      }
      pcVar4 = parse_options(inout_cmdln,defn,(int32)lVar9,argv,strict);
      return pcVar4;
    }
    if (uVar1 < 0x29) {
      uVar5 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      args[0].gp_offset = uVar1;
      plVar7 = plVar8;
      plVar8 = (long *)((long)local_e8 + uVar5);
    }
    else {
      plVar7 = plVar8 + 1;
      args[0].overflow_arg_area = plVar7;
    }
    if (*plVar8 == 0) break;
    n_elem = n_elem + 2;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
          ,0x2d1,"Number of arguments must be even!\n",in_R8,in_R9,args[0]._0_8_,
          args[0].overflow_arg_area,local_e8);
  return (cmd_ln_t *)0x0;
}

Assistant:

cmd_ln_t *
cmd_ln_init(cmd_ln_t *inout_cmdln, const arg_t *defn, int32 strict, ...)
{
    va_list args;
    const char *arg, *val;
    char **f_argv;
    int32 f_argc;

    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        ++f_argc;
        val = va_arg(args, const char*);
        if (val == NULL) {
            E_ERROR("Number of arguments must be even!\n");
            return NULL;
        }
        ++f_argc;
    }
    va_end(args);

    /* Now allocate f_argv */
    f_argv = (char**)ckd_calloc(f_argc, sizeof(*f_argv));
    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        f_argv[f_argc] = ckd_salloc(arg);
        ++f_argc;
        val = va_arg(args, const char*);
        f_argv[f_argc] = ckd_salloc(val);
        ++f_argc;
    }
    va_end(args);

    return parse_options(inout_cmdln, defn, f_argc, f_argv, strict);
}